

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamclient.cpp
# Opt level: O0

void __thiscall
hbm::streaming::StreamClient::subscribe(StreamClient *this,signalReferences_t *signalReferences)

{
  Controller *this_00;
  char *pcVar1;
  long in_RDI;
  signalReferences_t *in_stack_00000048;
  Controller *in_stack_00000050;
  Controller controller;
  string *in_stack_ffffffffffffff40;
  string *in_stack_ffffffffffffff48;
  string *in_stack_ffffffffffffff50;
  string *in_stack_ffffffffffffff58;
  Controller *in_stack_ffffffffffffff60;
  
  this_00 = (Controller *)(in_RDI + 0x40060);
  pcVar1 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&stack0xffffffffffffff50,pcVar1,(allocator *)&stack0xffffffffffffff4f);
  Controller::Controller
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
             in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff50);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff4f);
  Controller::subscribe(in_stack_00000050,in_stack_00000048);
  Controller::~Controller(this_00);
  return;
}

Assistant:

void StreamClient::subscribe(const signalReferences_t& signalReferences)
		{
			Controller controller(m_streamId, m_address.c_str(), m_controlPort, m_httpPath);
			controller.subscribe(signalReferences);
		}